

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall
OpenMD::ReplicateVisitor::ReplicateVisitor(ReplicateVisitor *this,SimInfo *info,Vector3i *opt)

{
  int *piVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int k;
  int j;
  int i;
  Vector3<int> *in_stack_ffffffffffffff68;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar2;
  undefined4 in_stack_ffffffffffffff80;
  int iVar3;
  int local_30;
  int local_2c;
  int local_28;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x34ba86);
  *in_RDI = &PTR__ReplicateVisitor_00486218;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x34baa3)
  ;
  in_RDI[8] = 0;
  Vector3<int>::Vector3
            ((Vector3<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  in_RDI[8] = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"ReplicateVisitor");
  for (local_28 = 0; piVar1 = Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RDI + 9),0),
      local_28 <= *piVar1; local_28 = local_28 + 1) {
    local_2c = 0;
    while (iVar3 = local_2c, piVar1 = Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RDI + 9),1)
          , iVar3 <= *piVar1) {
      local_30 = 0;
      while (iVar2 = local_30,
            piVar1 = Vector<int,_3U>::operator[]((Vector<int,_3U> *)(in_RDI + 9),2),
            iVar2 <= *piVar1) {
        if (((local_28 != 0) || (local_2c != 0)) || (local_30 != 0)) {
          __x = (value_type *)(in_RDI + 5);
          Vector3<double>::Vector3
                    ((Vector3<double> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),(double)piVar1,
                     (double)CONCAT44(iVar2,in_stack_ffffffffffffff70),(double)__x);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     CONCAT44(iVar2,in_stack_ffffffffffffff70),__x);
        }
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

ReplicateVisitor::ReplicateVisitor(SimInfo* info, Vector3i opt) :
      BaseVisitor(), replicateOpt(opt) {
    this->info  = info;
    visitorName = "ReplicateVisitor";

    // generate the replicate directions
    for (int i = 0; i <= replicateOpt[0]; i++) {
      for (int j = 0; j <= replicateOpt[1]; j++) {
        for (int k = 0; k <= replicateOpt[2]; k++) {
          // skip original frame
          if (i == 0 && j == 0 && k == 0) {
            continue;
          } else {
            dir.push_back(Vector3d((RealType)i, (RealType)j, (RealType)k));
          }
        }
      }
    }
  }